

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_conn.cpp
# Opt level: O0

void __thiscall CNetConnection::Disconnect(CNetConnection *this,char *pReason)

{
  int iVar1;
  CNetConnection *in_RSI;
  CNetConnection *in_RDI;
  CNetConnection *unaff_retaddr;
  char *in_stack_ffffffffffffffd8;
  CNetConnection *in_stack_ffffffffffffffe0;
  CNetConnection *pCVar2;
  int ControlMsg;
  
  pCVar2 = in_RDI;
  iVar1 = State(in_RDI);
  ControlMsg = (int)((ulong)pCVar2 >> 0x20);
  if (iVar1 != 0) {
    if (in_RDI->m_RemoteClosed == 0) {
      if (in_RSI == (CNetConnection *)0x0) {
        SendControl(unaff_retaddr,ControlMsg,(void *)0x0,(int)((ulong)in_RDI >> 0x20));
      }
      else {
        pCVar2 = in_RSI;
        str_length((char *)0x246606);
        SendControl(unaff_retaddr,ControlMsg,pCVar2,(int)((ulong)in_RDI >> 0x20));
        in_stack_ffffffffffffffe0 = in_RSI;
        in_RSI = pCVar2;
      }
      if (in_RSI != (CNetConnection *)in_RDI->m_ErrorString) {
        if (in_RSI == (CNetConnection *)0x0) {
          in_RDI->m_ErrorString[0] = '\0';
        }
        else {
          str_copy((char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,0);
        }
      }
    }
    Reset(in_stack_ffffffffffffffe0);
  }
  return;
}

Assistant:

void CNetConnection::Disconnect(const char *pReason)
{
	if(State() == NET_CONNSTATE_OFFLINE)
		return;

	if(m_RemoteClosed == 0)
	{
		if(pReason)
			SendControl(NET_CTRLMSG_CLOSE, pReason, str_length(pReason)+1);
		else
			SendControl(NET_CTRLMSG_CLOSE, 0, 0);

		if(pReason != m_ErrorString)
		{
			if(pReason)
				str_copy(m_ErrorString, pReason, sizeof(m_ErrorString));
			else
				m_ErrorString[0] = 0;
		}
	}

	Reset();
}